

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void character_behaviour(tgestate_t *state,vischar_t *vischar)

{
  route_t *route;
  uint8_t *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  undefined2 uVar5;
  undefined2 uVar6;
  bool bVar7;
  uint8_t uVar8;
  uint16_t *puVar9;
  mappos16_t *pmVar10;
  byte bVar11;
  short sVar12;
  long lVar13;
  char cVar14;
  short sVar15;
  ulong uVar16;
  uint uVar17;
  
  if ((vischar->counter_and_flags & 0xf) != 0) {
    vischar->counter_and_flags = vischar->counter_and_flags - 1;
    return;
  }
  switch(vischar->flags) {
  case '\x02':
    if (state->automatic_player_counter == '\0') goto LAB_0010ad91;
  case '\x01':
    (vischar->target).u = (state->hero_mappos).u;
    uVar8 = (state->hero_mappos).v;
LAB_0010ad47:
    (vischar->target).v = uVar8;
    break;
  case '\x03':
    if (-1 < (char)state->item_structs[7].room_and_flags) {
      vischar->flags = '\0';
      (vischar->route).index = 0xff;
      (vischar->route).step = '\0';
      get_target_assign_pos(state,vischar,&vischar->route);
      return;
    }
    (vischar->target).u = state->item_structs[7].mappos.u;
    uVar8 = state->item_structs[7].mappos.v;
    goto LAB_0010ad47;
  case '\x04':
    if (state->bribed_character != 0xff) {
      puVar9 = &state->vischars[1].mi.mappos.v;
      cVar14 = -7;
LAB_0010ad80:
      if (*(uint8_t *)(puVar9 + -0x11) != state->bribed_character) goto code_r0x0010ad89;
      if (state->room_index == '\0') {
        pmVar10 = (mappos16_t *)(puVar9 + -1);
        lVar13 = 0;
        do {
          puVar9 = &pmVar10->u;
          pmVar10 = (mappos16_t *)&pmVar10->v;
          (&(vischar->target).u)[lVar13] = (uint8_t)(*puVar9 + 4 >> 3);
          lVar13 = lVar13 + 1;
        } while ((char)lVar13 != '\x03');
        break;
      }
      (vischar->target).u = (uint8_t)((mappos16_t *)(puVar9 + -1))->u;
      uVar8 = (uint8_t)*puVar9;
      goto LAB_0010ad47;
    }
LAB_0010ad91:
    vischar->flags = '\0';
    get_target_assign_pos(state,vischar,&vischar->route);
    return;
  default:
    if ((vischar->route).index == '\0') {
      if (vischar->input == '\0') {
        return;
      }
      vischar->input = 0x80;
      return;
    }
  }
  sVar12 = 1;
  if (state->room_index == '\0') {
    sVar12 = (ushort)((vischar->flags & 0x40) == 0) * 4 + 4;
  }
  bVar11 = vischar->counter_and_flags;
  if ((bVar11 & 0x20) != 0) {
    sVar15 = (vischar->mi).mappos.v - (ushort)(vischar->target).v * sVar12;
    if (sVar15 < 3) {
      if (sVar15 < -2) {
        bVar11 = 7;
        goto LAB_0010ae15;
      }
      vischar->counter_and_flags = bVar11 & 0xdf;
      bVar7 = true;
      bVar11 = 0;
    }
    else {
      bVar11 = 5;
LAB_0010ae15:
      bVar7 = false;
    }
    if (!bVar7) goto LAB_0010ae85;
    uVar6 = (vischar->mi).mappos.u;
    sVar12 = uVar6 - sVar12 * (ushort)(vischar->target).u;
    if (sVar12 < 3) {
      if (sVar12 < -2) {
        bVar11 = 4;
        goto LAB_0010aea9;
      }
      vischar->counter_and_flags = vischar->counter_and_flags | 0x20;
      bVar7 = true;
      bVar11 = 0;
    }
    else {
      bVar11 = 8;
LAB_0010aea9:
      bVar7 = false;
    }
    if (bVar7) goto target_reached;
    goto LAB_0010aee5;
  }
  uVar5 = (vischar->mi).mappos.u;
  sVar15 = uVar5 - (ushort)(vischar->target).u * sVar12;
  if (sVar15 < 3) {
    if (sVar15 < -2) {
      bVar11 = 4;
      goto LAB_0010ae09;
    }
    vischar->counter_and_flags = bVar11 | 0x20;
    bVar7 = true;
    bVar11 = 0;
  }
  else {
    bVar11 = 8;
LAB_0010ae09:
    bVar7 = false;
  }
  if (!bVar7) {
LAB_0010ae85:
    if (vischar->input == bVar11) {
      return;
    }
    vischar->input = bVar11 | 0x80;
    return;
  }
  sVar12 = (vischar->mi).mappos.v - sVar12 * (ushort)(vischar->target).v;
  if (sVar12 < 3) {
    if (sVar12 < -2) {
      bVar11 = 7;
      goto LAB_0010ae9d;
    }
    vischar->counter_and_flags = vischar->counter_and_flags & 0xdf;
    bVar7 = true;
    bVar11 = 0;
  }
  else {
    bVar11 = 5;
LAB_0010ae9d:
    bVar7 = false;
  }
  if (bVar7) {
target_reached:
    bVar11 = vischar->flags;
    switch(bVar11 & 0x3f) {
    case 0:
      goto switchD_0010b31e_caseD_0;
    case 1:
      if (vischar->character != state->bribed_character) {
        solitary(state);
        return;
      }
      accept_bribe(state);
      return;
    case 2:
    case 4:
      return;
    default:
      state->food_discovered_counter =
           -((state->item_structs[7].item_and_flags >> 5 & 1) != 0) | 0x20;
      (vischar->route).index = '\0';
      if (vischar->input == '\0') {
        return;
      }
      vischar->input = 0x80;
      return;
    }
  }
LAB_0010aee5:
  if (vischar->input == bVar11) {
    return;
  }
  vischar->input = bVar11 | 0x80;
  return;
code_r0x0010ad89:
  puVar9 = puVar9 + 0x20;
  cVar14 = cVar14 + '\x01';
  if (cVar14 == '\0') goto LAB_0010ad91;
  goto LAB_0010ad80;
switchD_0010b31e_caseD_0:
  route = &vischar->route;
  if ((bVar11 & 0x40) != 0) {
    bVar2 = (vischar->route).step;
    bVar3 = (vischar->route).index;
    bVar4 = get_route::routes[bVar3 & 0x7f][bVar2];
    (vischar->route).step = ((char)bVar3 >> 7 | 1U) + bVar2;
    uVar17 = bVar4 & 0x7f;
    uVar16 = (ulong)((byte)((bVar3 ^ bVar4) >> 5) & 4);
    bVar2 = (&doors[(ulong)uVar17 * 2].room_and_direction)[uVar16];
    vischar->room = bVar2 >> 2;
    if (state->vischars == vischar) {
      vischar->flags = bVar11 & 0xbf;
      get_target_assign_pos(state,vischar,route);
    }
    transition(state,(mappos8_t *)
                     ((long)doors + (ulong)((bVar2 & 2) == 0) * 8 + uVar16 + (ulong)uVar17 * 8 + -3)
              );
    play_speaker(state,sound_CHARACTER_ENTERS_1);
    return;
  }
  if (route->index != 0xff) {
    puVar1 = &(vischar->route).step;
    *puVar1 = *puVar1 + ((char)route->index >> 7 | 1U);
  }
  get_target_assign_pos(state,vischar,route);
  return;
}

Assistant:

void character_behaviour(tgestate_t *state, vischar_t *vischar)
{
  uint8_t    flags;             /* was A */
  uint8_t    counter_and_flags; /* was B */
  uint8_t    iters;             /* was B */
  vischar_t *vischar2;          /* was HL */
  uint8_t    vischar2flags;     /* was C' */
  uint8_t    scale;             /* Conv: added */

  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);

  /* Proceed into the character behaviour handling only when this delay field
   * hits zero. This stops characters navigating around obstacles too
   * quickly. */
  counter_and_flags = vischar->counter_and_flags; // Conv: Use of A dropped.
  if (counter_and_flags & vischar_BYTE7_COUNTER_MASK)
  {
    vischar->counter_and_flags = --counter_and_flags;
    return;
  }

  vischar2 = vischar; // no need for separate HL and IY now other code reduced
  flags = vischar2->flags;
  if (flags != 0)
  {
    /* Mode 1: Hero is chased by hostiles and sent to solitary if caught. */
    if (flags == vischar_PURSUIT_PURSUE)
    {
pursue_hero:
      /* Pursue the hero. */
      vischar2->target.u = state->hero_mappos.u;
      vischar2->target.v = state->hero_mappos.v;
      goto move;
    }
    /* Mode 2: Hero is chased by hostiles if under player control. */
    else if (flags == vischar_PURSUIT_HASSLE)
    {
      if (state->automatic_player_counter > 0)
      {
        /* The hero is under player control: pursue. */
        goto pursue_hero;
      }
      else
      {
        /* The hero is under automatic control: hostiles lose interest and
         * resume following their original route. */
        vischar2->flags = 0; /* clear vischar_PURSUIT_HASSLE */
        get_target_assign_pos(state, vischar2, &vischar2->route);
        return;
      }
    }
    /* Mode 3: The food item is near a guard dog. */
    else if (flags == vischar_PURSUIT_DOG_FOOD)
    {
      if (state->item_structs[item_FOOD].room_and_flags & itemstruct_ROOM_FLAG_NEARBY_7)
      {
        /* Set dog target to poisoned food. */
        vischar2->target.u = state->item_structs[item_FOOD].mappos.u;
        vischar2->target.v = state->item_structs[item_FOOD].mappos.v;
        goto move;
      }
      else
      {
        /* Food is no longer nearby: Choose random locations in the fenced-
         * off area (right side). */
        vischar2->flags = 0; /* clear vischar_PURSUIT_DOG_FOOD */
        vischar2->route.index = routeindex_255_WANDER;
        vischar2->route.step  = 0; /* 0..7 */
        get_target_assign_pos(state, vischar2, &vischar2->route);
        return;
      }
    }
    /* Mode 4: Hostile character witnessed a bribe being given (in accept_bribe). */
    else if (flags == vischar_PURSUIT_SAW_BRIBE)
    {
      character_t  bribed_character; /* was A */
      vischar_t   *found;            /* was HL */

      bribed_character = state->bribed_character;
      if (bribed_character != character_NONE)
      {
        /* Iterate over non-player characters. */
        iters = vischars_LENGTH - 1;
        found = &state->vischars[1];
        do
        {
          if (found->character == bribed_character)
            goto bribed_visible;
          found++;
        }
        while (--iters);
      }

      /* Bribed character was not visible: hostiles lose interest and resume
       * following their original route. */
      vischar2->flags = 0; /* clear vischar_PURSUIT_SAW_BRIBE */
      get_target_assign_pos(state, vischar2, &vischar2->route);
      return;

bribed_visible:
      /* Found the bribed character in vischars: hostiles target him. */
      {
        mappos16_t *mappos; /* was HL */
        mappos8_t  *target; /* was DE */

        mappos = &found->mi.mappos;
        target = &vischar2->target;
        if (state->room_index == room_0_OUTDOORS)
        {
          /* Outdoors */
          scale_mappos_down(mappos, target);
        }
        else
        {
          /* Indoors */
          target->u = mappos->u; // note: narrowing
          target->v = mappos->v; // note: narrowing
        }
        goto move;
      }
    }
  }

  if (vischar2->route.index == routeindex_0_HALT) /* Stand still */
  {
    character_behaviour_set_input(state, vischar, 0 /* new_input */);
    return; /* was tail call */
  }

move:
  vischar2flags = vischar2->flags; // sampled = $8081, 80a1, 80e1, 8001, 8021, ...

  /* Conv: The original code here self modifies the vischar_move_u/v routines.
   *       The replacement code passes in a scale factor. */
  if (state->room_index > room_0_OUTDOORS)
    scale = 1; /* Indoors. */
  else if (vischar2flags & vischar_FLAGS_TARGET_IS_DOOR)
    scale = 4; /* Outdoors + door thing. */
  else
    scale = 8; /* Outdoors. */

  /* If the vischar_BYTE7_V_DOMINANT flag is set then we try moving on the v
   * axis then the u axis, rather than u then v. This is the code which makes
   * characters alternate left/right when navigating. */
  if (vischar->counter_and_flags & vischar_BYTE7_V_DOMINANT)
  {
    /* V dominant case */

    /* Conv: Inlined the chunk from $C9FF here. */

    input_t input; /* was A */

    input = vischar_move_v(state, vischar, scale);
    if (input)
    {
      character_behaviour_set_input(state, vischar, input);
    }
    else
    {
      input = vischar_move_u(state, vischar, scale);
      if (input)
        character_behaviour_set_input(state, vischar, input);
      else
        target_reached(state, vischar); /* was tail call */
    }
  }
  else
  {
    /* U dominant case */

    input_t input; /* was A */

    input = vischar_move_u(state, vischar, scale);
    if (input)
    {
      character_behaviour_set_input(state, vischar, input);
    }
    else
    {
      input = vischar_move_v(state, vischar, scale);
      if (input)
        character_behaviour_set_input(state, vischar, input);
      else
        target_reached(state, vischar); /* was tail call */
    }
  }
}